

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O0

void ProcessArgs(int argc,char **argv,int *sensi,int *sensi_meth,int *err_con)

{
  int iVar1;
  undefined4 *in_RCX;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  undefined4 *in_R8;
  
  *in_RDX = 0;
  *in_RCX = 0xffffffff;
  *in_R8 = 0;
  if (in_EDI < 2) {
    WrongArgs((char *)0x10331f);
  }
  iVar1 = strcmp(*(char **)(in_RSI + 8),"-nosensi");
  if (iVar1 == 0) {
    *in_RDX = 0;
  }
  else {
    iVar1 = strcmp(*(char **)(in_RSI + 8),"-sensi");
    if (iVar1 == 0) {
      *in_RDX = 1;
    }
    else {
      WrongArgs((char *)0x10337a);
    }
  }
  if (*in_RDX != 0) {
    if (in_EDI != 4) {
      WrongArgs((char *)0x10339e);
    }
    iVar1 = strcmp(*(char **)(in_RSI + 0x10),"sim");
    if (iVar1 == 0) {
      *in_RCX = 1;
    }
    else {
      iVar1 = strcmp(*(char **)(in_RSI + 0x10),"stg");
      if (iVar1 == 0) {
        *in_RCX = 2;
      }
      else {
        WrongArgs((char *)0x1033f9);
      }
    }
    iVar1 = strcmp(*(char **)(in_RSI + 0x18),"t");
    if (iVar1 == 0) {
      *in_R8 = 1;
    }
    else {
      iVar1 = strcmp(*(char **)(in_RSI + 0x18),"f");
      if (iVar1 == 0) {
        *in_R8 = 0;
      }
      else {
        WrongArgs((char *)0x103454);
      }
    }
  }
  return;
}

Assistant:

static void ProcessArgs(int argc, char* argv[], sunbooleantype* sensi,
                        int* sensi_meth, sunbooleantype* err_con)
{
  *sensi      = SUNFALSE;
  *sensi_meth = -1;
  *err_con    = SUNFALSE;

  if (argc < 2) { WrongArgs(argv[0]); }

  if (strcmp(argv[1], "-nosensi") == 0) { *sensi = SUNFALSE; }
  else if (strcmp(argv[1], "-sensi") == 0) { *sensi = SUNTRUE; }
  else { WrongArgs(argv[0]); }

  if (*sensi)
  {
    if (argc != 4) { WrongArgs(argv[0]); }

    if (strcmp(argv[2], "sim") == 0) { *sensi_meth = IDA_SIMULTANEOUS; }
    else if (strcmp(argv[2], "stg") == 0) { *sensi_meth = IDA_STAGGERED; }
    else { WrongArgs(argv[0]); }

    if (strcmp(argv[3], "t") == 0) { *err_con = SUNTRUE; }
    else if (strcmp(argv[3], "f") == 0) { *err_con = SUNFALSE; }
    else { WrongArgs(argv[0]); }
  }
}